

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O0

void __thiscall
VTKPointDescriptor<MercuryParticle<2UL>_>::~VTKPointDescriptor
          (VTKPointDescriptor<MercuryParticle<2UL>_> *this)

{
  bool bVar1;
  iterator this_00;
  reference ppVVar2;
  __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_**,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
  *in_RDI;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *d;
  iterator __end0;
  iterator __begin0;
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  *__range2;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_**,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (VTKPointDescriptorEntry<MercuryParticle<2UL>_> **)
       std::
       vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
       ::begin((vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
                *)in_stack_ffffffffffffffc8);
  this_00 = std::
            vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
            ::end((vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
                   *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_**,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_**,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc8 = *ppVVar2;
    if (in_stack_ffffffffffffffc8 != (VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)0x0) {
      (*in_stack_ffffffffffffffc8->_vptr_VTKPointDescriptorEntry[1])();
    }
    __gnu_cxx::
    __normal_iterator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_**,_std::vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>_>
    ::operator++(local_18);
  }
  std::
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ::~vector((vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
             *)this_00._M_current);
  return;
}

Assistant:

~VTKPointDescriptor()
  {
    for (auto * d : entries_)
      delete d;
  }